

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O0

TYPE_ID __thiscall TypesHierarchy::GiveSubClass(TypesHierarchy *this,TYPE_ID oldone,TYPE_ID newone)

{
  bool bVar1;
  TYPE_ID TVar2;
  size_type sVar3;
  reference pvVar4;
  reference puVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  uint *local_38;
  TYPE_ID local_2c;
  iterator iStack_28;
  TYPE_ID t;
  iterator it;
  TYPE_ID newone_local;
  TYPE_ID oldone_local;
  TypesHierarchy *this_local;
  
  it._M_current._0_4_ = newone;
  it._M_current._4_4_ = oldone;
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
  __normal_iterator(&stack0xffffffffffffffd8);
  local_2c = 0;
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(&this->types);
  if (sVar3 < it._M_current._4_4_) {
    pvVar4 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->types,(ulong)it._M_current._4_4_);
    local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
    iStack_28 = (iterator)local_38;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->types,(ulong)it._M_current._4_4_);
      local_40._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar4);
      bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_40);
      if (!bVar1) break;
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&stack0xffffffffffffffd8);
      if (*puVar5 == (TYPE_ID)it._M_current) {
        local_2c = (TYPE_ID)it._M_current;
      }
      else {
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&stack0xffffffffffffffd8);
        TVar2 = GiveSubClass(this,*puVar5,(TYPE_ID)it._M_current);
        local_2c = TVar2;
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&stack0xffffffffffffffd8);
        if (TVar2 == *puVar5) {
          local_2c = (TYPE_ID)it._M_current;
        }
      }
      if (local_2c != 0) break;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&stack0xffffffffffffffd8,0);
    }
    this_local._4_4_ = local_2c;
  }
  else {
    this_local._4_4_ = (TYPE_ID)it._M_current;
  }
  return this_local._4_4_;
}

Assistant:

TYPE_ID TypesHierarchy::GiveSubClass(TYPE_ID oldone, TYPE_ID newone) {
	vector<TYPE_ID>::iterator it;
	TYPE_ID t=0;

if (types.size() >= oldone) return newone; //hack

	for (it=types[oldone].begin(); it!=types[oldone].end(); it++) {
//		cerr << "====> new: " << newone << " ====> old: " << oldone << " ===> *it " << *it << endl;
			if (*it == newone) {
				t = newone;
			} else {
				t = GiveSubClass(*it, newone);
				if (t == *it) t = newone;
			}

			if (t) break;
	}
	return t;

}